

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O1

int sznet::net::sockets::sz_sock_setnonblock(sz_sock sock,bool nonblock)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_0000003c;
  
  uVar1 = fcntl64(CONCAT44(in_register_0000003c,sock),3,0);
  if (uVar1 != 0xffffffff) {
    iVar2 = fcntl64(sock,4,(uint)nonblock << 0xb | uVar1 & 0xfffff7ff);
    return iVar2;
  }
  return -1;
}

Assistant:

int sz_sock_setnonblock(sz_sock sock, bool nonblock)
{
#ifdef SZ_OS_LINUX
	int flag = ::fcntl(sock, F_GETFL, 0);
	if (flag == -1)
	{
		return -1;
	}

	if (nonblock)
	{
		flag |= O_NONBLOCK;
	}
	else
	{
		flag &= ~O_NONBLOCK;
	}
	return ::fcntl(sock, F_SETFL, flag);
#else
	u_long flag = nonblock ? 1 : 0;
	return ioctlsocket(sock, FIONBIO, &flag);
#endif
}